

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

_Bool fxp_got_attrs(sftp_packet *pktin,fxp_attrs *attrs)

{
  bool bVar1;
  fxp_attrs *attrs_local;
  sftp_packet *pktin_local;
  
  BinarySource_get_fxp_attrs(pktin->binarysource_,attrs);
  bVar1 = pktin->binarysource_[0].err == BSE_NO_ERROR;
  if (bVar1) {
    sftp_pkt_free(pktin);
  }
  else {
    fxp_internal_error("malformed SSH_FXP_ATTRS packet");
    sftp_pkt_free(pktin);
  }
  return bVar1;
}

Assistant:

static bool fxp_got_attrs(struct sftp_packet *pktin, struct fxp_attrs *attrs)
{
    get_fxp_attrs(pktin, attrs);
    if (get_err(pktin)) {
        fxp_internal_error("malformed SSH_FXP_ATTRS packet");
        sftp_pkt_free(pktin);
        return false;
    }
    sftp_pkt_free(pktin);
    return true;
}